

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_unary_expression(Analyser *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  string *psVar5;
  _Storage<Token,_false> local_148;
  optional<Token> next;
  any local_f0;
  string identifier;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  nextToken(&next,this);
  if (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged == false) {
    psVar5 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"Missing <expression>",(allocator<char> *)&local_148._M_value);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar5,local_40);
    *(long *)(psVar5 + 0x20) = (long)iVar1;
    __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
  }
  if (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type == MINUS_SIGN) {
    nextToken((optional<Token> *)&local_148._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,
               (_Optional_payload_base<Token> *)&local_148._M_value);
    std::_Optional_payload_base<Token>::_M_reset
              ((_Optional_payload_base<Token> *)&local_148._M_value);
    bVar2 = true;
  }
  else {
    if (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type == PLUS_SIGN) {
      nextToken((optional<Token> *)&local_148._M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,
                 (_Optional_payload_base<Token> *)&local_148._M_value);
      std::_Optional_payload_base<Token>::_M_reset
                ((_Optional_payload_base<Token> *)&local_148._M_value);
    }
    bVar2 = false;
  }
  if (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged == false) {
    psVar5 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_60,"Missing <primary-expression>",(allocator<char> *)&local_148._M_value);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar5,local_60);
    *(long *)(psVar5 + 0x20) = (long)iVar1;
    __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
  }
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  identifier._M_string_length = 0;
  identifier.field_2._M_local_buf[0] = '\0';
  if (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type == UNSIGNED_INTEGER) {
    local_148._4_4_ = addConstant(this,(Token *)&next);
    local_148._M_value._type = 6;
    local_148._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x100000000;
    addInstruction(this,(Instruction *)&local_148._M_value);
  }
  else if (next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_payload._M_value._type == IDENTIFIER) {
    std::any::any(&local_f0,
                  &next.super__Optional_base<Token,_false,_false>._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value);
    std::any_cast<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_148._M_value,&local_f0);
    std::__cxx11::string::operator=((string *)&identifier,(string *)&local_148._M_value);
    std::__cxx11::string::~string((string *)&local_148._M_value);
    std::any::reset(&local_f0);
    bVar3 = loadVariable(this,&identifier);
    if (bVar3) {
      local_148._0_8_ = 0x16;
      local_148._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&local_148._M_value);
    }
    else {
      cVar4 = getFunctionRetType(this,&identifier);
      if (cVar4 == 'v') {
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"Can not call void function in < expression >",
                   (allocator<char> *)&local_148._M_value);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar5,local_a0);
        *(long *)(psVar5 + 0x20) = (long)iVar1;
        __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
      }
      unreadToken(this);
      analyse_function_call(this);
    }
  }
  else {
    if (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type != LEFT_BRACKET) {
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"Missing <primary-expression>",(allocator<char> *)&local_148._M_value);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar5,local_c0);
      *(long *)(psVar5 + 0x20) = (long)iVar1;
      __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
    }
    analyse_expression(this);
    nextToken((optional<Token> *)&local_148._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,
               (_Optional_payload_base<Token> *)&local_148._M_value);
    std::_Optional_payload_base<Token>::_M_reset
              ((_Optional_payload_base<Token> *)&local_148._M_value);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged != true) ||
       (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type != RIGHT_BRACKET)) {
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"Missing \')\'",(allocator<char> *)&local_148._M_value);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar5,local_80);
      *(long *)(psVar5 + 0x20) = (long)iVar1;
      __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
    }
  }
  if (bVar2) {
    local_148._0_8_ = 0x18;
    local_148._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&local_148._M_value);
  }
  std::__cxx11::string::~string((string *)&identifier);
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
  return;
}

Assistant:

void Analyser::analyse_unary_expression() {
	auto next = nextToken();
	if (!next.has_value()) {
		throw Error("Missing <expression>", _currentLine);
	}
	//<unary - operator>
	std::int32_t factor = 1;
	if (next.value().GetType() == TokenType::PLUS_SIGN) {
		next = nextToken();
	}
	else if (next.value().GetType() == TokenType::MINUS_SIGN) {
		factor = -1;
		next = nextToken();
	}
	//primary - expression
	if (!next.has_value()) {
		throw Error("Missing <primary-expression>", _currentLine);
	}
	std::int32_t index;
	std::string identifier;
	char type;
	switch (next.value().GetType())
	{
	case TokenType::LEFT_BRACKET:
		analyse_expression();
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
			throw Error("Missing ')'", _currentLine);
		}
		break;
	case TokenType::IDENTIFIER:
		identifier = std::any_cast<std::string>(next.value().GetValue());
		if (!loadVariable(identifier)) {
			type = getFunctionRetType(identifier);
			if (type == 'v') {
				throw Error("Can not call void function in < expression >", _currentLine);
			}
			unreadToken();
			analyse_function_call();
		}
		else {
			addInstruction(Instruction(Operation::iload));
		}
		break;
	case TokenType::UNSIGNED_INTEGER:
		index = addConstant(next.value());
		addInstruction(Instruction(Operation::loadc, index));
		break;
	default:
		throw Error("Missing <primary-expression>", _currentLine);
		break;
	}
	if (factor == -1) {
		addInstruction(Instruction(Operation::ineg));
	}
}